

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetImportLinkProperty<cmLinkItem>
          (cmExportFileGenerator *this,string *suffix,cmGeneratorTarget *target,string *propName,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *entries,ImportPropertyMap *properties,
          ImportLinkPropertyTargetNames targetNames)

{
  cmLinkItem *pcVar1;
  cmLocalGenerator *lg;
  string *psVar2;
  mapped_type *pmVar3;
  cmLinkItem *l;
  cmLinkItem *this_00;
  string link_entries;
  string prop;
  string temp;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  if ((entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    pcVar1 = (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pcVar1; this_00 = this_00 + 1) {
      std::__cxx11::string::append((char *)&local_d0);
      if (targetNames == Yes) {
        psVar2 = cmLinkItem::AsStr_abi_cxx11_(this_00);
        std::__cxx11::string::string((string *)&local_90,(string *)psVar2);
        AddTargetNamespace(this,(string *)&local_90,target,lg);
        std::__cxx11::string::append((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        cmLinkItem::AsStr_abi_cxx11_(this_00);
        std::__cxx11::string::append((string *)&local_d0);
      }
    }
    local_90.View_._M_str = (propName->_M_dataplus)._M_p;
    local_90.View_._M_len = propName->_M_string_length;
    local_60.View_._M_str = (suffix->_M_dataplus)._M_p;
    local_60.View_._M_len = suffix->_M_string_length;
    cmStrCat<>(&local_b0,&local_90,&local_60);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&local_b0);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkProperty(
  std::string const& suffix, cmGeneratorTarget const* target,
  const std::string& propName, std::vector<T> const& entries,
  ImportPropertyMap& properties, ImportLinkPropertyTargetNames targetNames)
{
  // Skip the property if there are no entries.
  if (entries.empty()) {
    return;
  }

  cmLocalGenerator const* lg = target->GetLocalGenerator();

  // Construct the property value.
  std::string link_entries;
  const char* sep = "";
  for (T const& l : entries) {
    // Separate this from the previous entry.
    link_entries += sep;
    sep = ";";

    if (targetNames == ImportLinkPropertyTargetNames::Yes) {
      std::string temp = asString(l);
      this->AddTargetNamespace(temp, target, lg);
      link_entries += temp;
    } else {
      link_entries += asString(l);
    }
  }

  // Store the property.
  std::string prop = cmStrCat(propName, suffix);
  properties[prop] = link_entries;
}